

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

IdHideMap * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::objectFieldsAux
          (IdHideMap *__return_storage_ptr__,Interpreter *this,HeapObject *obj_)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  mapped_type *pmVar3;
  _Rb_tree_node_base *p_Var4;
  iterator iVar5;
  _Base_ptr p_Var6;
  HeapObject *obj__00;
  mapped_type mVar7;
  undefined1 auVar8 [16];
  _Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
  local_60;
  
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (this != (Interpreter *)0x0) {
    lVar2 = __dynamic_cast(this,&(anonymous_namespace)::HeapObject::typeinfo,
                           &(anonymous_namespace)::HeapSimpleObject::typeinfo,0);
    if (lVar2 == 0) {
      auVar8 = __dynamic_cast(this,&(anonymous_namespace)::HeapObject::typeinfo,
                              &(anonymous_namespace)::HeapExtendedObject::typeinfo,0);
      lVar2 = auVar8._0_8_;
      if (lVar2 == 0) {
        lVar2 = __dynamic_cast(this,&(anonymous_namespace)::HeapObject::typeinfo,
                               &(anonymous_namespace)::HeapComprehensionObject::typeinfo,0);
        if (lVar2 != 0) {
          for (p_Var4 = *(_Rb_tree_node_base **)(lVar2 + 0x68);
              p_Var4 != (_Rb_tree_node_base *)(lVar2 + 0x58);
              p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
            pmVar3 = std::
                     map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
                     ::operator[](__return_storage_ptr__,(key_type *)(p_Var4 + 1));
            *pmVar3 = INHERIT;
          }
        }
      }
      else {
        objectFieldsAux((IdHideMap *)&local_60,*(Interpreter **)(lVar2 + 0x18),auVar8._8_8_);
        std::
        _Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
        ::operator=(&__return_storage_ptr__->_M_t,&local_60);
        std::
        _Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
        ::~_Rb_tree(&local_60);
        objectFieldsAux((IdHideMap *)&local_60,*(Interpreter **)(lVar2 + 0x10),obj__00);
        for (p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var6 != &local_60._M_impl.super__Rb_tree_header;
            p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
          p_Var4 = p_Var6 + 1;
          iVar5 = std::
                  _Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
                  ::find(&__return_storage_ptr__->_M_t,(key_type *)p_Var4);
          if ((_Rb_tree_header *)iVar5._M_node == p_Var1) {
            mVar7 = *(mapped_type *)&p_Var6[1]._M_parent;
            pmVar3 = std::
                     map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
                     ::operator[](__return_storage_ptr__,(key_type *)p_Var4);
LAB_0017f78d:
            *pmVar3 = mVar7;
          }
          else if (*(int *)&iVar5._M_node[1]._M_parent == 1) {
            mVar7 = *(mapped_type *)&p_Var6[1]._M_parent;
            pmVar3 = std::
                     map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
                     ::operator[](__return_storage_ptr__,(key_type *)p_Var4);
            goto LAB_0017f78d;
          }
        }
        std::
        _Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
        ::~_Rb_tree(&local_60);
      }
    }
    else {
      for (p_Var4 = *(_Rb_tree_node_base **)(lVar2 + 0x58);
          p_Var4 != (_Rb_tree_node_base *)(lVar2 + 0x48);
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
        mVar7 = *(mapped_type *)&p_Var4[1]._M_parent;
        pmVar3 = std::
                 map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
                 ::operator[](__return_storage_ptr__,(key_type *)(p_Var4 + 1));
        *pmVar3 = mVar7;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

IdHideMap objectFieldsAux(const HeapObject *obj_)
    {
        IdHideMap r;
        if (auto *obj = dynamic_cast<const HeapSimpleObject *>(obj_)) {
            for (const auto &f : obj->fields) {
                r[f.first] = f.second.hide;
            }

        } else if (auto *obj = dynamic_cast<const HeapExtendedObject *>(obj_)) {
            r = objectFieldsAux(obj->right);
            for (const auto &pair : objectFieldsAux(obj->left)) {
                auto it = r.find(pair.first);
                if (it == r.end()) {
                    // First time it is seen
                    r[pair.first] = pair.second;
                } else if (it->second == ObjectField::INHERIT) {
                    // Seen before, but with inherited visibility so use new visibility
                    r[pair.first] = pair.second;
                }
            }

        } else if (auto *obj = dynamic_cast<const HeapComprehensionObject *>(obj_)) {
            for (const auto &f : obj->compValues)
                r[f.first] = ObjectField::INHERIT;
        }
        return r;
    }